

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

VkResult vk::wsi::createSurface
                   (InstanceInterface *vki,VkInstance instance,Type wsiType,Display *nativeDisplay,
                   Window *nativeWindow,VkAllocationCallbacks *pAllocator,VkSurfaceKHR *pSurface)

{
  DisplayInterface<0> *this;
  DisplayInterface<1> *this_00;
  DisplayInterface<2> *this_01;
  DisplayInterface<3> *this_02;
  DisplayInterface<5> *this_03;
  undefined4 local_180 [2];
  VkWin32SurfaceCreateInfoKHR createInfo_5;
  Win32WindowInterface *win32Window;
  Win32DisplayInterface *win32Display;
  VkAndroidSurfaceCreateInfoKHR createInfo_4;
  AndroidWindowInterface *androidWindow;
  VkMirSurfaceCreateInfoKHR createInfo_3;
  MirWindowInterface *mirWindow;
  MirDisplayInterface *mirDisplay;
  VkWaylandSurfaceCreateInfoKHR createInfo_2;
  WaylandWindowInterface *waylandWindow;
  WaylandDisplayInterface *waylandDisplay;
  VkXcbSurfaceCreateInfoKHR createInfo_1;
  XcbWindowInterface *xcbWindow;
  XcbDisplayInterface *xcbDisplay;
  VkXlibSurfaceCreateInfoKHR createInfo;
  XlibWindowInterface *xlibWindow;
  XlibDisplayInterface *xlibDisplay;
  VkAllocationCallbacks *pAllocator_local;
  Window *nativeWindow_local;
  Display *nativeDisplay_local;
  Type wsiType_local;
  VkInstance instance_local;
  InstanceInterface *vki_local;
  
  switch(wsiType) {
  case TYPE_XLIB:
    this = (DisplayInterface<0> *)
           __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<0>::typeinfo,0);
    if (this == (DisplayInterface<0> *)0x0) {
      __cxa_bad_cast();
    }
    createInfo.window.internal =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<0>::typeinfo,0);
    if (createInfo.window.internal == 0) {
      __cxa_bad_cast();
    }
    xcbDisplay._0_4_ = 0x3b9ad9a0;
    createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo._4_4_ = 0;
    createInfo.pNext._0_4_ = 0;
    createInfo._16_8_ = DisplayInterface<0>::getNative(this);
    createInfo.dpy.internal =
         (void *)WindowInterface<0>::getNative((WindowInterface<0> *)createInfo.window.internal);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x19])(vki,instance,&xcbDisplay,pAllocator,pSurface);
    break;
  case TYPE_XCB:
    this_00 = (DisplayInterface<1> *)
              __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<1>::typeinfo,0);
    if (this_00 == (DisplayInterface<1> *)0x0) {
      __cxa_bad_cast();
    }
    createInfo_1.window.internal =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<1>::typeinfo,0);
    if (createInfo_1.window.internal == 0) {
      __cxa_bad_cast();
    }
    waylandDisplay._0_4_ = 0x3b9add88;
    createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_1._4_4_ = 0;
    createInfo_1.pNext._0_4_ = 0;
    createInfo_1._16_8_ = DisplayInterface<1>::getNative(this_00);
    createInfo_1.connection.internal =
         (void *)WindowInterface<1>::getNative((WindowInterface<1> *)createInfo_1.window.internal);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x1b])(vki,instance,&waylandDisplay,pAllocator,pSurface);
    break;
  case TYPE_WAYLAND:
    this_01 = (DisplayInterface<2> *)
              __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<2>::typeinfo,0);
    if (this_01 == (DisplayInterface<2> *)0x0) {
      __cxa_bad_cast();
    }
    createInfo_2._32_8_ =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<2>::typeinfo,0);
    if (createInfo_2._32_8_ == 0) {
      __cxa_bad_cast();
    }
    mirDisplay._0_4_ = 0x3b9ae170;
    createInfo_2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_2._4_4_ = 0;
    createInfo_2.pNext._0_4_ = 0;
    createInfo_2._16_8_ = DisplayInterface<2>::getNative(this_01);
    createInfo_2._24_8_ = WindowInterface<2>::getNative((WindowInterface<2> *)createInfo_2._32_8_);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x1d])(vki,instance,&mirDisplay,pAllocator,pSurface);
    break;
  case TYPE_MIR:
    this_02 = (DisplayInterface<3> *)
              __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<3>::typeinfo,0);
    if (this_02 == (DisplayInterface<3> *)0x0) {
      __cxa_bad_cast();
    }
    createInfo_3._32_8_ =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<3>::typeinfo,0);
    if (createInfo_3._32_8_ == 0) {
      __cxa_bad_cast();
    }
    androidWindow._0_4_ = 0x3b9ae558;
    createInfo_3.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_3._4_4_ = 0;
    createInfo_3.pNext._0_4_ = 0;
    createInfo_3._16_8_ = DisplayInterface<3>::getNative(this_02);
    createInfo_3._24_8_ = WindowInterface<3>::getNative((WindowInterface<3> *)createInfo_3._32_8_);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x1f])(vki,instance,&androidWindow,pAllocator,pSurface);
    break;
  case TYPE_ANDROID:
    createInfo_4._24_8_ =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<4>::typeinfo,0);
    if ((WindowInterface<4> *)createInfo_4._24_8_ == (WindowInterface<4> *)0x0) {
      __cxa_bad_cast();
    }
    win32Display._0_4_ = 0x3b9ae940;
    createInfo_4.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_4._4_4_ = 0;
    createInfo_4.pNext._0_4_ = 0;
    createInfo_4._16_8_ = WindowInterface<4>::getNative((WindowInterface<4> *)createInfo_4._24_8_);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x21])(vki,instance,&win32Display,pAllocator,pSurface);
    break;
  case TYPE_WIN32:
    this_03 = (DisplayInterface<5> *)
              __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<5>::typeinfo,0);
    if (this_03 == (DisplayInterface<5> *)0x0) {
      __cxa_bad_cast();
    }
    createInfo_5._32_8_ =
         __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<5>::typeinfo,0);
    if (createInfo_5._32_8_ == 0) {
      __cxa_bad_cast();
    }
    local_180[0] = 0x3b9aed28;
    createInfo_5.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_5._4_4_ = 0;
    createInfo_5.pNext._0_4_ = 0;
    createInfo_5._16_8_ = DisplayInterface<5>::getNative(this_03);
    createInfo_5._24_8_ = WindowInterface<5>::getNative((WindowInterface<5> *)createInfo_5._32_8_);
    vki_local._4_4_ =
         (*vki->_vptr_InstanceInterface[0x22])(vki,instance,local_180,pAllocator,pSurface);
    break;
  default:
    vki_local._4_4_ = VK_ERROR_SURFACE_LOST_KHR;
  }
  return vki_local._4_4_;
}

Assistant:

VkResult createSurface (const InstanceInterface&		vki,
						VkInstance						instance,
						Type							wsiType,
						const Display&					nativeDisplay,
						const Window&					nativeWindow,
						const VkAllocationCallbacks*	pAllocator,
						VkSurfaceKHR*					pSurface)
{
	// Update this function if you add more WSI implementations
	DE_STATIC_ASSERT(TYPE_LAST == 6);

	switch (wsiType)
	{
		case TYPE_XLIB:
		{
			const XlibDisplayInterface&			xlibDisplay		= dynamic_cast<const XlibDisplayInterface&>(nativeDisplay);
			const XlibWindowInterface&			xlibWindow		= dynamic_cast<const XlibWindowInterface&>(nativeWindow);
			const VkXlibSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_XLIB_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXlibSurfaceCreateFlagsKHR)0,
				xlibDisplay.getNative(),
				xlibWindow.getNative()
			};

			return vki.createXlibSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_XCB:
		{
			const XcbDisplayInterface&			xcbDisplay		= dynamic_cast<const XcbDisplayInterface&>(nativeDisplay);
			const XcbWindowInterface&			xcbWindow		= dynamic_cast<const XcbWindowInterface&>(nativeWindow);
			const VkXcbSurfaceCreateInfoKHR		createInfo		=
			{
				VK_STRUCTURE_TYPE_XCB_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXcbSurfaceCreateFlagsKHR)0,
				xcbDisplay.getNative(),
				xcbWindow.getNative()
			};

			return vki.createXcbSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_WAYLAND:
		{
			const WaylandDisplayInterface&		waylandDisplay	= dynamic_cast<const WaylandDisplayInterface&>(nativeDisplay);
			const WaylandWindowInterface&		waylandWindow	= dynamic_cast<const WaylandWindowInterface&>(nativeWindow);
			const VkWaylandSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_WAYLAND_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkWaylandSurfaceCreateFlagsKHR)0,
				waylandDisplay.getNative(),
				waylandWindow.getNative()
			};

			return vki.createWaylandSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_MIR:
		{
			const MirDisplayInterface&			mirDisplay		= dynamic_cast<const MirDisplayInterface&>(nativeDisplay);
			const MirWindowInterface&			mirWindow		= dynamic_cast<const MirWindowInterface&>(nativeWindow);
			const VkMirSurfaceCreateInfoKHR		createInfo		=
			{
				VK_STRUCTURE_TYPE_MIR_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXcbSurfaceCreateFlagsKHR)0,
				mirDisplay.getNative(),
				mirWindow.getNative()
			};

			return vki.createMirSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_ANDROID:
		{
			const AndroidWindowInterface&		androidWindow	= dynamic_cast<const AndroidWindowInterface&>(nativeWindow);
			const VkAndroidSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_ANDROID_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkAndroidSurfaceCreateFlagsKHR)0,
				androidWindow.getNative()
			};

			return vki.createAndroidSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_WIN32:
		{
			const Win32DisplayInterface&		win32Display	= dynamic_cast<const Win32DisplayInterface&>(nativeDisplay);
			const Win32WindowInterface&			win32Window		= dynamic_cast<const Win32WindowInterface&>(nativeWindow);
			const VkWin32SurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_WIN32_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkWin32SurfaceCreateFlagsKHR)0,
				win32Display.getNative(),
				win32Window.getNative()
			};

			return vki.createWin32SurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		default:
			DE_FATAL("Unknown WSI type");
			return VK_ERROR_SURFACE_LOST_KHR;
	}
}